

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O3

int google::protobuf::compiler::ruby::GeneratePackageModules(FileDescriptor *file,Printer *printer)

{
  pointer pcVar1;
  size_type sVar2;
  void *pvVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  char *__s;
  string_view text;
  string_view str;
  string_view str_00;
  string_view name;
  string delimiter;
  string package_name;
  string component;
  byte local_bc;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  long local_a8 [2];
  char *local_98;
  char *local_90;
  char local_88;
  undefined7 uStack_87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_98 = &local_88;
  local_90 = (char *)0x0;
  local_88 = '\0';
  if ((*(byte *)((long)&file->options_->field_0 + 0x19) & 2) == 0) {
    pcVar1 = (file->package_->_M_dataplus)._M_p;
    local_b8._M_len = (size_t)local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,pcVar1,pcVar1 + file->package_->_M_string_length);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
    if ((long *)local_b8._M_len != local_a8) {
      operator_delete((void *)local_b8._M_len,local_a8[0] + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_98);
    local_b8._M_len = (size_t)local_90;
    local_b8._M_str = local_98;
    __s = "::";
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_b8,"::",0,2);
    pcVar6 = local_98;
    if (sVar2 != 0xffffffffffffffff) {
      local_bc = 0;
      goto LAB_0020b31e;
    }
    if ((local_90 != (char *)0x0) &&
       (pvVar3 = memchr(local_98,0x2e,(size_t)local_90),
       (long)pvVar3 - (long)pcVar6 != -1 && pvVar3 != (void *)0x0)) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                 ,0xac);
      str._M_str = "ruby_package option should be in the form of:";
      str._M_len = 0x2d;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_b8,str);
      str_00._M_str = " \'A::B::C\' and not \'A.B.C\'";
      str_00._M_len = 0x1a;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_b8,str_00);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_b8);
    }
  }
  __s = ".";
  local_bc = 1;
LAB_0020b31e:
  local_b8._M_len = (size_t)local_a8;
  sVar4 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,__s,__s + sVar4);
  if (local_90 == (char *)0x0) {
    iVar7 = 0;
  }
  else {
    local_38 = 2 - (ulong)local_bc;
    iVar7 = 0;
    do {
      lVar5 = std::__cxx11::string::find((char *)&local_98,local_b8._M_len,0);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      if (lVar5 == -1) {
        std::__cxx11::string::_M_assign((string *)&local_78);
        pcVar6 = "";
        std::__cxx11::string::_M_replace((ulong)&local_98,0,local_90,0x4f289c);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_98);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        pcVar6 = (char *)0xffffffffffffffff;
        std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_98);
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_bc != 0) {
        name._M_str = pcVar6;
        name._M_len = (size_t)local_78._M_dataplus._M_p;
        PackageToModule_abi_cxx11_(&local_58,(ruby *)local_78._M_string_length,name);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      text._M_str = "module $name$\n";
      text._M_len = 0xe;
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,text,(char (*) [5])0x6fff3e,&local_78);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      iVar7 = iVar7 + 1;
    } while (local_90 != (char *)0x0);
  }
  if ((long *)local_b8._M_len != local_a8) {
    operator_delete((void *)local_b8._M_len,local_a8[0] + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return iVar7;
}

Assistant:

int GeneratePackageModules(const FileDescriptor* file, io::Printer* printer) {
  int levels = 0;
  bool need_change_to_module = true;
  std::string package_name;

  // Determine the name to use in either format:
  //   proto package:         one.two.three
  //   option ruby_package:   One::Two::Three
  if (file->options().has_ruby_package()) {
    package_name = file->options().ruby_package();

    // If :: is in the package use the Ruby formatted name as-is
    //    -> A::B::C
    // otherwise, use the dot separator
    //    -> A.B.C
    if (absl::StrContains(package_name, "::")) {
      need_change_to_module = false;
    } else if (absl::StrContains(package_name, '.')) {
      ABSL_LOG(WARNING) << "ruby_package option should be in the form of:"
                        << " 'A::B::C' and not 'A.B.C'";
    }
  } else {
    package_name = std::string(file->package());
  }

  // Use the appropriate delimiter
  std::string delimiter = need_change_to_module ? "." : "::";
  size_t delimiter_size = need_change_to_module ? 1 : 2;

  // Extract each module name and indent
  while (!package_name.empty()) {
    size_t dot_index = package_name.find(delimiter);
    std::string component;
    if (dot_index == std::string::npos) {
      component = package_name;
      package_name = "";
    } else {
      component = package_name.substr(0, dot_index);
      package_name = package_name.substr(dot_index + delimiter_size);
    }
    if (need_change_to_module) {
      component = PackageToModule(component);
    }
    printer->Print("module $name$\n", "name", component);
    printer->Indent();
    levels++;
  }
  return levels;
}